

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::parse_some
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  csv_parse_state cVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  basic_csv_parser<char,_std::allocator<char>_> *this_00;
  m_columns_filter<char,_std::allocator<char>_> *in_RSI;
  basic_csv_parser<char,_std::allocator<char>_> *in_RDI;
  int in_stack_00000030;
  bool in_stack_00000037;
  basic_json_visitor<char> *in_stack_00000038;
  m_columns_filter<char,_std::allocator<char>_> *in_stack_00000040;
  char curr_char;
  char *local_input_end;
  basic_json_visitor<char> *local_visitor;
  undefined4 in_stack_ffffffffffffff78;
  csv_parse_state in_stack_ffffffffffffff7c;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_json_visitor<char> *in_stack_ffffffffffffff88;
  csv_errc cVar10;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  byte local_55;
  bool trim_leading;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  cVar10 = (csv_errc)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RDI->mapping_kind_ == m_columns) {
    in_RSI = &in_RDI->m_columns_filter_;
  }
  if (in_RDI->mapping_kind_ == m_columns) {
    in_RDI->cursor_mode_ = false;
  }
  pcVar2 = in_RDI->input_end_;
  if ((in_RDI->input_ptr_ == pcVar2) && ((in_RDI->more_ & 1U) != 0)) {
    switch(in_RDI->state_) {
    case start:
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cVar10)
      ;
      in_RDI->more_ = false;
      return;
    default:
      in_RDI->state_ = end_record;
      break;
    case end_record:
      if (in_RDI->column_index_ != 0) {
        end_record(in_stack_ffffffffffffffa0,
                   (basic_json_visitor<char> *)
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      in_RDI->state_ = no_more_records;
      break;
    case no_more_records:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == header) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f3fb3);
      }
      else if (*pvVar7 == data) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f3fc6);
      }
      basic_json_visitor<char>::end_array
                ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                 (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (error_code *)0x3f3fde);
      in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
      if ((in_RDI->mapping_kind_ != m_columns) &&
         (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
        in_RDI->more_ = false;
      }
      in_RDI->level_ = in_RDI->level_ + -1;
      if (in_RDI->mapping_kind_ == m_columns) {
        bVar4 = detail::m_columns_filter<char,_std::allocator<char>_>::done
                          (&in_RDI->m_columns_filter_);
        if (bVar4) {
          in_RDI->state_ = accept;
        }
        else {
          bVar4 = detail::m_columns_filter<char,_std::allocator<char>_>::replay_parse_events
                            (in_stack_00000040,in_stack_00000038,in_stack_00000037,in_stack_00000030
                            );
          in_RDI->more_ = bVar4;
        }
      }
      else {
        in_RDI->state_ = accept;
      }
      break;
    case before_unquoted_string:
      std::__cxx11::string::clear();
    case unquoted_string:
      if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
        trim_string_buffer(in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0));
      }
      if (((in_RDI->ignore_empty_values_ & 1U) == 0) ||
         (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->state_ = before_unquoted_field;
      }
      else {
        in_RDI->state_ = end_record;
      }
      break;
    case escaped_value:
      if (in_RDI->quote_escape_char_ != in_RDI->quote_char_) {
        std::error_code::operator=
                  ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   cVar10);
        in_RDI->more_ = false;
        return;
      }
      if (((in_RDI->ignore_empty_values_ & 1U) == 0) ||
         (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->state_ = before_last_quoted_field;
      }
      else {
        in_RDI->state_ = end_record;
      }
      break;
    case accept:
      sVar9 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::size
                        (&in_RDI->stack_);
      if ((sVar9 == 1) &&
         (pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
                   back((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *
                        )in_stack_ffffffffffffff80), *pvVar7 == initial)) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f4118);
        basic_json_visitor<char>::flush((basic_json_visitor<char> *)0x3f4122);
        in_RDI->state_ = done;
        in_RDI->more_ = false;
      }
      else {
        std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::operator()
                  ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cVar10,
                   &in_stack_ffffffffffffff80->super_ser_context);
        std::error_code::operator=
                  ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   cVar10);
        in_RDI->more_ = false;
      }
      return;
    case before_unquoted_field:
    case before_last_unquoted_field:
      end_unquoted_string_value
                (in_stack_ffffffffffffffa0,
                 (basic_json_visitor<char> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_last_unquoted_field_tail;
      break;
    case before_last_unquoted_field_tail:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == subfields) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f3d6d);
        basic_json_visitor<char>::end_array
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                   (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (error_code *)0x3f3d81);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        if ((in_RDI->mapping_kind_ != m_columns) &&
           (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
          in_RDI->more_ = false;
        }
        in_RDI->level_ = in_RDI->level_ + -1;
      }
      in_RDI->column_index_ = in_RDI->column_index_ + 1;
      in_RDI->state_ = end_record;
      break;
    case before_last_quoted_field:
      end_quoted_string_value
                (in_stack_ffffffffffffffa0,
                 (basic_json_visitor<char> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->column_index_ = in_RDI->column_index_ + 1;
      in_RDI->state_ = end_record;
    }
  }
  while( true ) {
    cVar10 = (csv_errc)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    local_55 = 0;
    if (in_RDI->input_ptr_ < pcVar2) {
      local_55 = in_RDI->more_;
    }
    if ((local_55 & 1) == 0) break;
    cVar1 = *in_RDI->input_ptr_;
    in_stack_ffffffffffffffd4 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffd4);
    this_00 = (basic_csv_parser<char,_std::allocator<char>_> *)(ulong)in_RDI->state_;
    bVar4 = SUB81((ulong)in_RSI >> 0x30,0);
    trim_leading = SUB81((ulong)in_RSI >> 0x38,0);
    cVar3 = (char)in_RDI;
    switch(this_00) {
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x0:
      if (in_RDI->mapping_kind_ != m_columns) {
        basic_json_visitor<char>::begin_array
                  ((basic_json_visitor<char> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (semantic_tag)((ulong)in_stack_ffffffffffffff88 >> 0x38),
                   &in_stack_ffffffffffffff80->super_ser_context,
                   (error_code *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        in_RDI->level_ = in_RDI->level_ + 1;
      }
      if ((((in_RDI->assume_header_ & 1U) == 0) || (in_RDI->mapping_kind_ != n_rows)) ||
         (bVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)), bVar4))
      {
        in_RDI->state_ = expect_comment_or_record;
      }
      else {
        in_RDI->column_index_ = 0;
        basic_json_visitor<char>::begin_array
                  ((basic_json_visitor<char> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (semantic_tag)((ulong)in_stack_ffffffffffffff88 >> 0x38),
                   &in_stack_ffffffffffffff80->super_ser_context,
                   (error_code *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RDI->level_ = in_RDI->level_ + 1;
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        in_RDI->state_ = expect_comment_or_record;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1:
      in_RDI->line_ = in_RDI->line_ + 1;
      in_RDI->column_ = 1;
      if (*in_RDI->input_ptr_ == '\n') {
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        cVar6 = pop_state((basic_csv_parser<char,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        in_RDI->state_ = cVar6;
      }
      else {
        cVar6 = pop_state((basic_csv_parser<char,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        in_RDI->state_ = cVar6;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x2:
      std::__cxx11::string::clear();
      if ((char)((uint)in_stack_ffffffffffffffd4 >> 0x18) == in_RDI->comment_starter_) {
        in_RDI->state_ = comment;
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      }
      else {
        in_RDI->state_ = expect_record;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x3:
      in_stack_ffffffffffffff88 = (basic_json_visitor<char> *)(ulong)((int)cVar1 - 9);
      switch(in_stack_ffffffffffffff88) {
      case (basic_json_visitor<char> *)0x0:
      case (basic_json_visitor<char> *)0x17:
        if ((in_RDI->trim_leading_ & 1U) == 0) {
          std::__cxx11::string::push_back(cVar3 + -0x38);
          begin_record((basic_csv_parser<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
          in_RDI->state_ = unquoted_string;
        }
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        break;
      case (basic_json_visitor<char> *)0x1:
        if ((in_RDI->ignore_empty_lines_ & 1U) == 0) {
          begin_record((basic_csv_parser<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
          in_RDI->state_ = end_record;
        }
        else {
          in_RDI->line_ = in_RDI->line_ + 1;
          in_RDI->column_ = 1;
          in_RDI->state_ = expect_comment_or_record;
          in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        }
        break;
      default:
        begin_record((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
        if ((char)((uint)in_stack_ffffffffffffffd4 >> 0x18) == in_RDI->quote_char_) {
          std::__cxx11::string::clear();
          in_RDI->state_ = quoted_string;
          in_RDI->column_ = in_RDI->column_ + 1;
          in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        }
        else {
          in_RDI->state_ = unquoted_string;
        }
        break;
      case (basic_json_visitor<char> *)0x4:
        if ((in_RDI->ignore_empty_lines_ & 1U) == 0) {
          begin_record((basic_csv_parser<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,(error_code *)in_stack_ffffffffffffff80);
          in_RDI->state_ = end_record;
        }
        else {
          in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
          push_state(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          in_RDI->state_ = cr;
        }
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x4:
      in_stack_ffffffffffffff80 =
           (basic_csv_parser<char,_std::allocator<char>_> *)(ulong)((int)cVar1 - 9);
      switch(in_stack_ffffffffffffff80) {
      case (basic_csv_parser<char,_std::allocator<char>_> *)0x0:
      case (basic_csv_parser<char,_std::allocator<char>_> *)0x17:
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        break;
      case (basic_csv_parser<char,_std::allocator<char>_> *)0x1:
        in_RDI->line_ = in_RDI->line_ + 1;
        in_RDI->column_ = 1;
        in_RDI->state_ = expect_comment_or_record;
        end_record(this_00,(basic_json_visitor<char> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        break;
      default:
        std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::operator()
                  ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cVar10,
                   (ser_context *)in_stack_ffffffffffffff80);
        std::error_code::operator=
                  ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   cVar10);
        in_RDI->more_ = false;
        return;
      case (basic_csv_parser<char,_std::allocator<char>_> *)0x4:
        in_RDI->line_ = in_RDI->line_ + 1;
        in_RDI->column_ = 1;
        in_RDI->state_ = expect_comment_or_record;
        end_record(this_00,(basic_json_visitor<char> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        push_state(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RDI->state_ = cr;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      }
      break;
    default:
      std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::operator()
                ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cVar10,
                 &in_stack_ffffffffffffff80->super_ser_context);
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cVar10)
      ;
      in_RDI->more_ = false;
      return;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x6:
      in_stack_ffffffffffffff9c = (int)cVar1;
      if (in_stack_ffffffffffffff9c == 10) {
        in_RDI->line_ = in_RDI->line_ + 1;
        pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
                 back((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                      in_stack_ffffffffffffff80);
        if (*pvVar7 == header) {
          in_RDI->header_line_offset_ = in_RDI->header_line_offset_ + 1;
        }
        in_RDI->column_ = 1;
        in_RDI->state_ = expect_comment_or_record;
      }
      else if (in_stack_ffffffffffffff9c == 0xd) {
        in_RDI->line_ = in_RDI->line_ + 1;
        pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
                 back((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                      in_stack_ffffffffffffff80);
        if (*pvVar7 == header) {
          in_RDI->header_line_offset_ = in_RDI->header_line_offset_ + 1;
        }
        in_RDI->column_ = 1;
        in_RDI->state_ = expect_comment_or_record;
        push_state(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RDI->state_ = cr;
      }
      else {
        in_RDI->column_ = in_RDI->column_ + 1;
      }
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x7:
      in_stack_ffffffffffffff98 = (int)cVar1;
      if ((in_stack_ffffffffffffff98 == 10) || (in_stack_ffffffffffffff98 == 0xd)) {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        if (((in_RDI->ignore_empty_values_ & 1U) == 0) ||
           (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
          before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (basic_json_visitor<char> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (error_code *)in_RDI);
          in_RDI->state_ = before_last_quoted_field;
        }
        else {
          in_RDI->state_ = end_record;
        }
      }
      else if (cVar1 == in_RDI->field_delimiter_) {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->state_ = before_quoted_field;
      }
      else if ((in_RDI->subfield_delimiter_ == '\0') || (cVar1 != in_RDI->subfield_delimiter_)) {
        if ((cVar1 != ' ') && (cVar1 != '\t')) {
          std::error_code::operator=
                    ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     cVar10);
          in_RDI->more_ = false;
          return;
        }
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      }
      else {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->state_ = before_quoted_subfield;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x8:
      if (cVar1 == in_RDI->quote_escape_char_) {
        in_RDI->state_ = escaped_value;
      }
      else if (cVar1 == in_RDI->quote_char_) {
        in_RDI->state_ = between_values;
      }
      else {
        std::__cxx11::string::push_back(cVar3 + -0x38);
      }
      in_RDI->column_ = in_RDI->column_ + 1;
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x9:
      in_stack_ffffffffffffff94 = (int)cVar1;
      if ((in_stack_ffffffffffffff94 == 10) || (in_stack_ffffffffffffff94 == 0xd)) {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        if (((in_RDI->ignore_empty_values_ & 1U) == 0) ||
           (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
          before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (basic_json_visitor<char> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (error_code *)in_RDI);
          in_RDI->state_ = before_last_unquoted_field;
        }
        else {
          in_RDI->state_ = end_record;
        }
      }
      else if (cVar1 == in_RDI->field_delimiter_) {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->state_ = before_unquoted_field;
      }
      else if ((in_RDI->subfield_delimiter_ == '\0') || (cVar1 != in_RDI->subfield_delimiter_)) {
        if (cVar1 == in_RDI->quote_char_) {
          std::__cxx11::string::clear();
          in_RDI->state_ = quoted_string;
          in_RDI->column_ = in_RDI->column_ + 1;
          in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        }
        else {
          std::__cxx11::string::push_back(cVar3 + -0x38);
          in_RDI->column_ = in_RDI->column_ + 1;
          in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
        }
      }
      else {
        if (((in_RDI->trim_leading_ & 1U) != 0) || ((in_RDI->trim_trailing_ & 1U) != 0)) {
          trim_string_buffer(in_RDI,trim_leading,bVar4);
        }
        before_value((basic_csv_parser<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (basic_json_visitor<char> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (error_code *)in_RDI);
        in_RDI->state_ = before_unquoted_subfield;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0xa:
      std::__cxx11::string::clear();
      in_RDI->state_ = unquoted_string;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0xb:
      if (cVar1 == in_RDI->quote_char_) {
        std::__cxx11::string::push_back(cVar3 + -0x38);
        in_RDI->state_ = quoted_string;
        in_RDI->column_ = in_RDI->column_ + 1;
        in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      }
      else {
        if (in_RDI->quote_escape_char_ != in_RDI->quote_char_) {
          std::error_code::operator=
                    ((error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     cVar10);
          in_RDI->more_ = false;
          return;
        }
        in_RDI->state_ = between_values;
      }
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x14:
      end_unquoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_unquoted_field_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x15:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == subfields) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f47ab);
        basic_json_visitor<char>::end_array
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                   (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (error_code *)0x3f47bf);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        if ((in_RDI->mapping_kind_ != m_columns) &&
           (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
          in_RDI->more_ = false;
        }
        in_RDI->level_ = in_RDI->level_ + -1;
      }
      in_RDI->column_index_ = in_RDI->column_index_ + 1;
      in_RDI->state_ = before_unquoted_string;
      in_RDI->column_ = in_RDI->column_ + 1;
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x16:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == subfields) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f4871);
        basic_json_visitor<char>::end_array
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                   (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (error_code *)0x3f4885);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        if ((in_RDI->mapping_kind_ != m_columns) &&
           (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
          in_RDI->more_ = false;
        }
        in_RDI->level_ = in_RDI->level_ + -1;
      }
      in_RDI->state_ = end_record;
      in_RDI->column_ = in_RDI->column_ + 1;
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x17:
      end_unquoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_last_unquoted_field_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x18:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == subfields) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f4950);
        basic_json_visitor<char>::end_array
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                   (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (error_code *)0x3f4964);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        if ((in_RDI->mapping_kind_ != m_columns) &&
           (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
          in_RDI->more_ = false;
        }
        in_RDI->level_ = in_RDI->level_ + -1;
      }
      in_RDI->column_index_ = in_RDI->column_index_ + 1;
      in_RDI->state_ = end_record;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x19:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == data) {
        in_stack_ffffffffffffffd0 = 3;
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::push_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   in_stack_ffffffffffffff80,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        basic_json_visitor<char>::begin_array
                  ((basic_json_visitor<char> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (semantic_tag)((ulong)in_stack_ffffffffffffff88 >> 0x38),
                   &in_stack_ffffffffffffff80->super_ser_context,
                   (error_code *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        in_RDI->level_ = in_RDI->level_ + 1;
      }
      in_RDI->state_ = before_unquoted_subfield_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1a:
      end_unquoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_unquoted_string;
      in_RDI->column_ = in_RDI->column_ + 1;
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1b:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == data) {
        in_stack_ffffffffffffffcc = 3;
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::push_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   in_stack_ffffffffffffff80,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        basic_json_visitor<char>::begin_array
                  ((basic_json_visitor<char> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (semantic_tag)((ulong)in_stack_ffffffffffffff88 >> 0x38),
                   &in_stack_ffffffffffffff80->super_ser_context,
                   (error_code *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        in_RDI->level_ = in_RDI->level_ + 1;
      }
      in_RDI->state_ = before_quoted_subfield_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1c:
      end_quoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_unquoted_string;
      in_RDI->column_ = in_RDI->column_ + 1;
      in_RDI->input_ptr_ = in_RDI->input_ptr_ + 1;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1d:
      end_quoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_unquoted_field_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x1f:
      end_quoted_string_value
                (this_00,(basic_json_visitor<char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (error_code *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->state_ = before_last_quoted_field_tail;
      break;
    case (basic_csv_parser<char,_std::allocator<char>_> *)0x20:
      pvVar7 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                         ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           *)in_stack_ffffffffffffff80);
      if (*pvVar7 == subfields) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::pop_back
                  ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
                   0x3f4bbe);
        basic_json_visitor<char>::end_array
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
                   (ser_context *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (error_code *)0x3f4bd2);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        if ((in_RDI->mapping_kind_ != m_columns) &&
           (iVar5 = level(in_RDI), iVar5 == in_RDI->mark_level_)) {
          in_RDI->more_ = false;
        }
        in_RDI->level_ = in_RDI->level_ + -1;
      }
      in_RDI->column_index_ = in_RDI->column_index_ + 1;
      in_RDI->state_ = end_record;
    }
    if (in_RDI->max_lines_ < in_RDI->line_) {
      in_RDI->state_ = done;
      in_RDI->more_ = false;
    }
  }
  return;
}

Assistant:

void parse_some(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        basic_json_visitor<CharT>& local_visitor = (mapping_kind_ == csv_mapping_kind::m_columns) 
            ? m_columns_filter_ : visitor;

        switch (mapping_kind_)
        {
            case csv_mapping_kind::m_columns:
                cursor_mode_ = false;
                break;
            default:
                break;
        } 

        const CharT* local_input_end = input_end_;

        if (input_ptr_ == local_input_end && more_)
        {
            switch (state_)
            {
                case csv_parse_state::start:
                    ec = csv_errc::source_error;
                    more_ = false;
                    return;
                case csv_parse_state::before_unquoted_field:
                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;
                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::before_unquoted_string: 
                    buffer_.clear();
                    JSONCONS_FALLTHROUGH;
                case csv_parse_state::unquoted_string: 
                    if (trim_leading_ || trim_trailing_)
                    {
                        trim_string_buffer(trim_leading_,trim_trailing_);
                    }
                    if (ignore_empty_values_ && buffer_.empty())
                    {
                        state_ = csv_parse_state::end_record;
                    }
                    else
                    {
                        before_value(local_visitor, ec);
                        state_ = csv_parse_state::before_unquoted_field;
                    }
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::escaped_value:
                    if (quote_escape_char_ == quote_char_)
                    {
                        if (!(ignore_empty_values_ && buffer_.empty()))
                        {
                            before_value(local_visitor, ec);
                            ++column_;
                            state_ = csv_parse_state::before_last_quoted_field;
                        }
                        else
                        {
                            state_ = csv_parse_state::end_record;
                        }
                    }
                    else
                    {
                        ec = csv_errc::invalid_escaped_char;
                        more_ = false;
                        return;
                    }
                    break;
                case csv_parse_state::end_record:
                    if (column_index_ > 0)
                    {
                        end_record(local_visitor, ec);
                    }
                    state_ = csv_parse_state::no_more_records;
                    break;
                case csv_parse_state::no_more_records: 
                    switch (stack_.back()) 
                    {
                        case csv_mode::header:
                            stack_.pop_back();
                            break;
                        case csv_mode::data:
                            stack_.pop_back();
                            break;
                        default:
                            break;
                    }
                    local_visitor.end_array(*this, ec);
                    more_ = !cursor_mode_;
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        if (level() == mark_level_)
                        {
                            more_ = false;
                        }
                    }
                    --level_;
                    
                    if (mapping_kind_ == csv_mapping_kind::m_columns)
                    {
                        if (!m_columns_filter_.done())
                        {
                            more_ = m_columns_filter_.replay_parse_events(visitor, actual_cursor_mode_, mark_level_);
                        }
                        else
                        {
                            state_ = csv_parse_state::accept;
                        }
                    }
                    else
                    {
                        state_ = csv_parse_state::accept;
                    }
                    break;
                case csv_parse_state::accept:
                    if (!(stack_.size() == 1 && stack_.back() == csv_mode::initial))
                    {
                        err_handler_(csv_errc::unexpected_eof, *this);
                        ec = csv_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    stack_.pop_back();
                    local_visitor.flush();
                    state_ = csv_parse_state::done;
                    more_ = false;
                    return;
                default:
                    state_ = csv_parse_state::end_record;
                    break;
            }
        }

        for (; (input_ptr_ < local_input_end) && more_;)
        {
            CharT curr_char = *input_ptr_;

            switch (state_) 
            {
                case csv_parse_state::cr:
                    ++line_;
                    column_ = 1;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            state_ = pop_state();
                            break;
                        default:
                            state_ = pop_state();
                            break;
                    }
                    break;
                case csv_parse_state::start:
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows && !column_names_.empty())
                    {
                        column_index_ = 0; 
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        ++level_;
                        more_ = !cursor_mode_;
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    break;
                case csv_parse_state::comment: 
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            break;
                        }
                        case '\r':
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            break;
                        default:
                            ++column_;
                            break;
                    }
                    ++input_ptr_;
                    break;
                
                case csv_parse_state::expect_comment_or_record:
                    buffer_.clear();
                    if (curr_char == comment_starter_)
                    {
                        state_ = csv_parse_state::comment;
                        ++column_;
                        ++input_ptr_;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_record;
                    }
                    break;
                case csv_parse_state::quoted_string: 
                    {
                        if (curr_char == quote_escape_char_)
                        {
                            state_ = csv_parse_state::escaped_value;
                        }
                        else if (curr_char == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                        }
                    }
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::escaped_value: 
                    {
                        if (curr_char == quote_char_)
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                            state_ = csv_parse_state::quoted_string;
                            ++column_;
                            ++input_ptr_;
                        }
                        else if (quote_escape_char_ == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            ec = csv_errc::invalid_escaped_char;
                            more_ = false;
                            return;
                        }
                    }
                    break;
                case csv_parse_state::between_values:
                    switch (curr_char)
                    {
                        case '\r':
                        case '\n':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_quoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_subfield;
                            }
                            else if (curr_char == ' ' || curr_char == '\t')
                            {
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                ec = csv_errc::unexpected_char_between_fields;
                                more_ = false;
                                return;
                            }
                            break;
                    }
                    break;
                case csv_parse_state::before_unquoted_string: 
                {
                    buffer_.clear();
                    state_ = csv_parse_state::unquoted_string;
                    break;
                }
                case csv_parse_state::before_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail;
                    break;
                case csv_parse_state::before_unquoted_field_tail:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                }
                case csv_parse_state::before_unquoted_field_tail1:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    state_ = csv_parse_state::end_record;
                    ++column_;
                    ++input_ptr_;
                    break;
                }

                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;

                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;

                case csv_parse_state::before_unquoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_unquoted_subfield_tail;
                    break; 
                case csv_parse_state::before_unquoted_subfield_tail:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail; // return to unquoted
                    break;
                case csv_parse_state::before_quoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_quoted_subfield_tail;
                    break; 
                case csv_parse_state::before_quoted_subfield_tail:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_quoted_field_tail;
                    break;
                case csv_parse_state::before_last_quoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::unquoted_string: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        case '\r':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_unquoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_subfield;
                            }
                            else if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                ++column_;
                                ++input_ptr_;
                            }
                            break;
                    }
                    break;
                }
                case csv_parse_state::expect_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++line_;
                                column_ = 1;
                                state_ = csv_parse_state::expect_comment_or_record;
                                ++input_ptr_;
                            }
                            break;
                        }
                        case '\r':
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++input_ptr_;
                                push_state(state_);
                                state_ = csv_parse_state::cr;
                            }
                            break;
                        case ' ':
                        case '\t':
                            if (!trim_leading_)
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::unquoted_string;
                            }
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            begin_record(local_visitor, ec);
                            if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                state_ = csv_parse_state::unquoted_string;
                            }
                            break;
                        }
                    break;
                    }
                case csv_parse_state::end_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            ++input_ptr_;
                            break;
                        }
                        case '\r':
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            ++input_ptr_;
                            break;
                        case ' ':
                        case '\t':
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            err_handler_(csv_errc::syntax_error, *this);
                            ec = csv_errc::syntax_error;
                            more_ = false;
                            return;
                        }
                    break;
                }
                default:
                    err_handler_(csv_errc::invalid_parse_state, *this);
                    ec = csv_errc::invalid_parse_state;
                    more_ = false;
                    return;
            }
            if (line_ > max_lines_)
            {
                state_ = csv_parse_state::done;
                more_ = false;
            }
        }
    }